

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::fill<kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest)

{
  Array<kj::StringTree::Branch> *pAVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pcVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  Branch *pBVar8;
  char *pcVar9;
  size_t sVar10;
  
  pcVar9 = (char *)(this->text).content.size_;
  if (pcVar9 != (char *)0x0) {
    pcVar9 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar9;
  sVar2 = (first->content).size_;
  sVar10 = 0;
  if (sVar2 != 0) {
    sVar10 = sVar2 - 1;
  }
  pcVar9 = (first->content).ptr;
  pAVar3 = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  pBVar4 = (this->branches).ptr;
  pBVar4[branchIndex].content.size_ = sVar10;
  pcVar5 = pBVar4[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar6 = pBVar4[branchIndex].content.text.content.size_;
    pBVar4[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar4[branchIndex].content.text.content.size_ = 0;
    pAVar7 = pBVar4[branchIndex].content.text.content.disposer;
    (**pAVar7->_vptr_ArrayDisposer)(pAVar7,pcVar5,1,sVar6,sVar6,0,sVar10,pcVar9,sVar2,pAVar3,0,0,0);
  }
  pBVar4[branchIndex].content.text.content.ptr = pcVar9;
  pBVar4[branchIndex].content.text.content.size_ = sVar2;
  pBVar4[branchIndex].content.text.content.disposer = pAVar3;
  pAVar1 = &pBVar4[branchIndex].content.branches;
  pBVar8 = pBVar4[branchIndex].content.branches.ptr;
  if (pBVar8 != (Branch *)0x0) {
    sVar2 = pBVar4[branchIndex].content.branches.size_;
    pAVar1->ptr = (Branch *)0x0;
    pBVar4[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar4[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar8,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct,sVar10,0,0);
  }
  pAVar1->ptr = (Branch *)0x0;
  pBVar4[branchIndex].content.branches.size_ = 0;
  pBVar4[branchIndex].content.branches.disposer = (ArrayDisposer *)0x0;
  if (rest->size_ != 0) {
    memcpy(pos,rest->ptr,rest->size_);
    return;
  }
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}